

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.cpp
# Opt level: O0

data_view * __thiscall helics::Input::checkAndGetFedUpdate(Input *this)

{
  bool bVar1;
  ValueFederate *in_RSI;
  ValueFederate *in_RDI;
  ValueFederate *inp;
  
  inp = in_RDI;
  if ((*(ValueFederate **)&in_RSI->field_0x38 == (ValueFederate *)0x0) ||
     ((bVar1 = helics::ValueFederate::isUpdated(in_RDI,(Input *)in_RDI), !bVar1 &&
      (bVar1 = allowDirectFederateUpdate((Input *)in_RSI), !bVar1)))) {
    memset(in_RDI,0,0x20);
    data_view::data_view((data_view *)inp);
  }
  else {
    helics::ValueFederate::getBytes(in_RSI,(Input *)inp);
  }
  return (data_view *)inp;
}

Assistant:

data_view Input::checkAndGetFedUpdate()
{
    return ((fed != nullptr) && (fed->isUpdated(*this) || allowDirectFederateUpdate())) ?
        (fed->getBytes(*this)) :
        data_view{};
}